

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O2

CURLcode Curl_is_connected(connectdata *conn,int sockindex,_Bool *connected)

{
  Curl_easy *data;
  long lVar1;
  undefined8 uVar2;
  Curl_addrinfo *pCVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  int iVar8;
  _Bool _Var9;
  CURLcode CVar10;
  uint uVar11;
  CURLcode CVar12;
  timediff_t tVar13;
  int *piVar14;
  char *pcVar15;
  ulong uVar16;
  long lVar17;
  curltime cVar18;
  curltime newer;
  curltime older;
  curltime older_00;
  int error;
  int local_1a0;
  CURLcode local_19c;
  curltime local_198;
  long local_188;
  _Bool *local_180;
  ulong local_178;
  ulong local_170;
  char ipaddress [46];
  char buffer [256];
  
  data = conn->data;
  error = 0;
  *connected = false;
  if ((conn->bits).tcpconnect[sockindex] == true) {
    *connected = true;
    CVar10 = CURLE_OK;
  }
  else {
    cVar18 = Curl_now();
    local_198.tv_sec = cVar18.tv_sec;
    local_198.tv_usec = cVar18.tv_usec;
    local_170 = Curl_timeleft(data,&local_198,true);
    if ((long)local_170 < 0) {
      Curl_failf(data,"Connection time-out");
      CVar10 = CURLE_OPERATION_TIMEDOUT;
    }
    else if ((conn->cnnct).state - CONNECT_SOCKS_INIT < 0x10) {
      CVar10 = connect_SOCKS(conn,sockindex,connected);
      if ((CVar10 == CURLE_OK) && (CVar10 = CURLE_OK, *connected == true)) {
LAB_001264a6:
        post_SOCKS(conn,sockindex,connected);
        CVar10 = CURLE_OK;
      }
    }
    else {
      local_19c = CURLE_OK;
      local_1a0 = sockindex;
      local_188 = (long)sockindex;
      local_180 = connected;
      for (lVar17 = 0; lVar17 != 2; lVar17 = lVar17 + 1) {
        if (conn->tempsock[lVar17] != -1) {
          uVar11 = Curl_socket_check(-1,-1,conn->tempsock[lVar17],0);
          uVar16 = (ulong)((uint)lVar17 ^ 1);
          if (uVar11 == 2) {
LAB_001262f4:
            _Var9 = verifyconnect(conn->tempsock[lVar17],&error);
            if (_Var9) {
              conn->sock[local_188] = conn->tempsock[lVar17];
              pCVar3 = conn->tempaddr[lVar17];
              conn->ip_addr = pCVar3;
              conn->tempsock[lVar17] = -1;
              *(uint *)&(conn->bits).field_0x4 =
                   *(uint *)&(conn->bits).field_0x4 & 0xfffff7ff |
                   (uint)(pCVar3->ai_family == 10) << 0xb;
              if (conn->tempsock[uVar16] != -1) {
                Curl_closesocket(conn,conn->tempsock[uVar16]);
                conn->tempsock[uVar16] = -1;
              }
              connected = local_180;
              sockindex = local_1a0;
              CVar10 = connect_SOCKS(conn,local_1a0,local_180);
              if (CVar10 != CURLE_OK) {
                return CVar10;
              }
              if (*connected != true) {
                return CURLE_OK;
              }
              goto LAB_001264a6;
            }
            Curl_infof(data,"Connection failed\n");
          }
          else if (uVar11 == 0) {
            error = 0;
            cVar18.tv_usec = local_198.tv_usec;
            cVar18.tv_sec = local_198.tv_sec;
            uVar4 = (conn->connecttime).tv_sec;
            uVar5 = (conn->connecttime).tv_usec;
            older.tv_usec = uVar5;
            older.tv_sec = uVar4;
            cVar18._12_4_ = 0;
            older._12_4_ = 0;
            tVar13 = Curl_timediff(cVar18,older);
            if (conn->timeoutms_per_addr <= tVar13) {
              Curl_infof(data,"After %ldms connect time, move on!\n");
              error = 0x6e;
            }
            if (((lVar17 == 0) && (conn->tempaddr[1] == (Curl_addrinfo *)0x0)) &&
               (newer.tv_usec = local_198.tv_usec, newer.tv_sec = local_198.tv_sec,
               uVar6 = (conn->connecttime).tv_sec, uVar7 = (conn->connecttime).tv_usec,
               older_00.tv_usec = uVar7, older_00.tv_sec = uVar6, newer._12_4_ = 0,
               older_00._12_4_ = 0, tVar13 = Curl_timediff(newer,older_00),
               (data->set).happy_eyeballs_timeout <= tVar13)) {
              trynextip(conn,local_1a0,1);
            }
          }
          else {
            if (((conn->bits).field_0x7 & 8) != 0) goto LAB_001262f4;
            if ((uVar11 & 4) != 0) {
              verifyconnect(conn->tempsock[lVar17],&error);
            }
          }
          iVar8 = error;
          if (error != 0) {
            (data->state).os_errno = error;
            piVar14 = __errno_location();
            *piVar14 = iVar8;
            if (conn->tempaddr[lVar17] != (Curl_addrinfo *)0x0) {
              local_178 = uVar16;
              Curl_printable_address(conn->tempaddr[lVar17],ipaddress,0x2e);
              lVar1 = conn->port;
              pcVar15 = Curl_strerror(error,buffer,0x100);
              Curl_infof(data,"connect to %s port %ld failed: %s\n",ipaddress,lVar1,pcVar15);
              conn->timeoutms_per_addr =
                   local_170 >> (conn->tempaddr[lVar17]->ai_next != (Curl_addrinfo *)0x0);
              CVar10 = trynextip(conn,local_1a0,(uint)lVar17);
              if ((CVar10 != CURLE_COULDNT_CONNECT) || (conn->tempsock[local_178] == -1)) {
                local_19c = CVar10;
              }
            }
          }
        }
      }
      CVar10 = CURLE_OK;
      if ((local_19c != CURLE_OK) &&
         ((CVar12 = local_19c, conn->tempaddr[1] != (Curl_addrinfo *)0x0 ||
          (CVar12 = trynextip(conn,local_1a0,1), CVar12 != CURLE_OK)))) {
        uVar11 = *(uint *)&(conn->bits).field_0x4;
        lVar17 = 0x390;
        if ((-1 < (char)uVar11) &&
           ((lVar17 = 0x3d0, (uVar11 & 0x40) == 0 && (lVar17 = 0x370, (uVar11 & 8) == 0)))) {
          lVar17 = 0x340;
        }
        uVar2 = *(undefined8 *)((conn->cnnct).socksreq + lVar17 + -0xc);
        lVar17 = conn->port;
        pcVar15 = Curl_strerror(error,buffer,0x100);
        Curl_failf(data,"Failed to connect to %s port %ld: %s",uVar2,lVar17,pcVar15);
        CVar10 = CVar12;
        if ((data->state).os_errno == 0x6e) {
          CVar10 = CURLE_OPERATION_TIMEDOUT;
        }
      }
    }
  }
  return CVar10;
}

Assistant:

CURLcode Curl_is_connected(struct connectdata *conn,
                           int sockindex,
                           bool *connected)
{
  struct Curl_easy *data = conn->data;
  CURLcode result = CURLE_OK;
  timediff_t allow;
  int error = 0;
  struct curltime now;
  int rc;
  int i;

  DEBUGASSERT(sockindex >= FIRSTSOCKET && sockindex <= SECONDARYSOCKET);

  *connected = FALSE; /* a very negative world view is best */

  if(conn->bits.tcpconnect[sockindex]) {
    /* we are connected already! */
    *connected = TRUE;
    return CURLE_OK;
  }

  now = Curl_now();

  /* figure out how long time we have left to connect */
  allow = Curl_timeleft(data, &now, TRUE);

  if(allow < 0) {
    /* time-out, bail out, go home */
    failf(data, "Connection time-out");
    return CURLE_OPERATION_TIMEDOUT;
  }

  if(SOCKS_STATE(conn->cnnct.state)) {
    /* still doing SOCKS */
    result = connect_SOCKS(conn, sockindex, connected);
    if(!result && *connected)
      post_SOCKS(conn, sockindex, connected);
    return result;
  }

  for(i = 0; i<2; i++) {
    const int other = i ^ 1;
    if(conn->tempsock[i] == CURL_SOCKET_BAD)
      continue;

#ifdef ENABLE_QUIC
    if(conn->transport == TRNSPRT_QUIC) {
      result = Curl_quic_is_connected(conn, i, connected);
      if(result) {
        error = SOCKERRNO;
        goto error;
      }
      if(*connected) {
        /* use this socket from now on */
        conn->sock[sockindex] = conn->tempsock[i];
        conn->ip_addr = conn->tempaddr[i];
        conn->tempsock[i] = CURL_SOCKET_BAD;
        connkeep(conn, "HTTP/3 default");
      }
      return result;
    }
#endif

#ifdef mpeix
    /* Call this function once now, and ignore the results. We do this to
       "clear" the error state on the socket so that we can later read it
       reliably. This is reported necessary on the MPE/iX operating system. */
    (void)verifyconnect(conn->tempsock[i], NULL);
#endif

    /* check socket for connect */
    rc = SOCKET_WRITABLE(conn->tempsock[i], 0);

    if(rc == 0) { /* no connection yet */
      error = 0;
      if(Curl_timediff(now, conn->connecttime) >= conn->timeoutms_per_addr) {
        infof(data, "After %" CURL_FORMAT_TIMEDIFF_T
              "ms connect time, move on!\n", conn->timeoutms_per_addr);
        error = ETIMEDOUT;
      }

      /* should we try another protocol family? */
      if(i == 0 && conn->tempaddr[1] == NULL &&
         (Curl_timediff(now, conn->connecttime) >=
          data->set.happy_eyeballs_timeout)) {
        trynextip(conn, sockindex, 1);
      }
    }
    else if(rc == CURL_CSELECT_OUT || conn->bits.tcp_fastopen) {
      if(verifyconnect(conn->tempsock[i], &error)) {
        /* we are connected with TCP, awesome! */

        /* use this socket from now on */
        conn->sock[sockindex] = conn->tempsock[i];
        conn->ip_addr = conn->tempaddr[i];
        conn->tempsock[i] = CURL_SOCKET_BAD;
#ifdef ENABLE_IPV6
        conn->bits.ipv6 = (conn->ip_addr->ai_family == AF_INET6)?TRUE:FALSE;
#endif

        /* close the other socket, if open */
        if(conn->tempsock[other] != CURL_SOCKET_BAD) {
          Curl_closesocket(conn, conn->tempsock[other]);
          conn->tempsock[other] = CURL_SOCKET_BAD;
        }

        /* see if we need to kick off any SOCKS proxy magic once we
           connected */
        result = connect_SOCKS(conn, sockindex, connected);
        if(result || !*connected)
          return result;

        post_SOCKS(conn, sockindex, connected);

        return CURLE_OK;
      }
      infof(data, "Connection failed\n");
    }
    else if(rc & CURL_CSELECT_ERR)
      (void)verifyconnect(conn->tempsock[i], &error);

#ifdef ENABLE_QUIC
    error:
#endif
    /*
     * The connection failed here, we should attempt to connect to the "next
     * address" for the given host. But first remember the latest error.
     */
    if(error) {
      data->state.os_errno = error;
      SET_SOCKERRNO(error);
      if(conn->tempaddr[i]) {
        CURLcode status;
#ifndef CURL_DISABLE_VERBOSE_STRINGS
        char ipaddress[MAX_IPADR_LEN];
        char buffer[STRERROR_LEN];
        Curl_printable_address(conn->tempaddr[i], ipaddress, MAX_IPADR_LEN);
#endif
        infof(data, "connect to %s port %ld failed: %s\n",
              ipaddress, conn->port,
              Curl_strerror(error, buffer, sizeof(buffer)));

        conn->timeoutms_per_addr = conn->tempaddr[i]->ai_next == NULL ?
          allow : allow / 2;

        status = trynextip(conn, sockindex, i);
        if((status != CURLE_COULDNT_CONNECT) ||
           conn->tempsock[other] == CURL_SOCKET_BAD)
          /* the last attempt failed and no other sockets remain open */
          result = status;
      }
    }
  }

  if(result) {
    /* no more addresses to try */
    const char *hostname;
    char buffer[STRERROR_LEN];

    /* if the first address family runs out of addresses to try before
       the happy eyeball timeout, go ahead and try the next family now */
    if(conn->tempaddr[1] == NULL) {
      result = trynextip(conn, sockindex, 1);
      if(!result)
        return result;
    }

    if(conn->bits.socksproxy)
      hostname = conn->socks_proxy.host.name;
    else if(conn->bits.httpproxy)
      hostname = conn->http_proxy.host.name;
    else if(conn->bits.conn_to_host)
      hostname = conn->conn_to_host.name;
    else
      hostname = conn->host.name;

    failf(data, "Failed to connect to %s port %ld: %s",
          hostname, conn->port,
          Curl_strerror(error, buffer, sizeof(buffer)));

#ifdef WSAETIMEDOUT
    if(WSAETIMEDOUT == data->state.os_errno)
      result = CURLE_OPERATION_TIMEDOUT;
#elif defined(ETIMEDOUT)
    if(ETIMEDOUT == data->state.os_errno)
      result = CURLE_OPERATION_TIMEDOUT;
#endif
  }

  return result;
}